

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O0

FT_Bool sfnt_get_name_id(TT_Face face,FT_UShort id,FT_Int *win,FT_Int *apple)

{
  TT_NameRec *pTVar1;
  bool local_39;
  TT_Name name;
  FT_Int n;
  FT_Int *apple_local;
  FT_Int *win_local;
  FT_UShort id_local;
  TT_Face face_local;
  
  *win = -1;
  *apple = -1;
  for (name._4_4_ = 0; name._4_4_ < (int)(uint)face->num_names; name._4_4_ = name._4_4_ + 1) {
    pTVar1 = (face->name_table).names + name._4_4_;
    if ((pTVar1->nameID == id) && (pTVar1->stringLength != 0)) {
      if (((pTVar1->platformID == 3) && ((pTVar1->encodingID == 1 || (pTVar1->encodingID == 0)))) &&
         ((pTVar1->languageID == 0x409 || (*win == -1)))) {
        *win = name._4_4_;
      }
      if (((pTVar1->platformID == 1) && (pTVar1->encodingID == 0)) &&
         ((pTVar1->languageID == 0 || (*apple == -1)))) {
        *apple = name._4_4_;
      }
    }
  }
  local_39 = true;
  if (*win < 0) {
    local_39 = -1 < *apple;
  }
  return local_39;
}

Assistant:

static FT_Bool
  sfnt_get_name_id( TT_Face    face,
                    FT_UShort  id,
                    FT_Int    *win,
                    FT_Int    *apple )
  {
    FT_Int  n;


    *win   = -1;
    *apple = -1;

    for ( n = 0; n < face->num_names; n++ )
    {
      TT_Name  name = face->name_table.names + n;


      if ( name->nameID == id && name->stringLength > 0 )
      {
        if ( IS_WIN( name ) && ( name->languageID == 0x409 || *win == -1 ) )
          *win = n;

        if ( IS_APPLE( name ) && ( name->languageID == 0 || *apple == -1 ) )
          *apple = n;
      }
    }

    return ( *win >= 0 ) || ( *apple >= 0 );
  }